

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O3

void __thiscall DebugInfo::ComputeDerivedData(DebugInfo *this)

{
  uint32_t *puVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  pointer pcVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pCVar7;
  pointer pOVar8;
  ContribInfo *ctr;
  ulong uVar9;
  ulong uVar10;
  iterator iVar11;
  pointer pCVar12;
  int iVar13;
  char cVar14;
  pointer pSVar15;
  TemplateInfo info;
  string templateName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  templateToIndex;
  TemplateInfo local_c0;
  key_type local_98;
  vector<TemplateInfo,std::allocator<TemplateInfo>> *local_78;
  DebugInfo *local_70;
  pointer local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar15 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pSVar15 != local_68) {
    local_78 = (vector<TemplateInfo,std::allocator<TemplateInfo>> *)&this->m_Templates;
    local_70 = this;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar4 = (pSVar15->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar4,pcVar4 + (pSVar15->name)._M_string_length);
      cVar14 = (char)&local_98;
      uVar9 = std::__cxx11::string::find(cVar14,0x3c);
      if (uVar9 != 0xffffffffffffffff) {
        do {
          uVar10 = uVar9 + 1;
          if (local_98._M_string_length <= uVar10) break;
          iVar13 = 1;
          do {
            if (local_98._M_dataplus._M_p[uVar10] == '>') {
              iVar13 = iVar13 + -1;
              if (iVar13 == 0) goto LAB_001029c2;
            }
            else {
              iVar13 = iVar13 + (uint)(local_98._M_dataplus._M_p[uVar10] == '<');
            }
            uVar10 = uVar10 + 1;
          } while (local_98._M_string_length != uVar10);
          if (iVar13 != 0) break;
LAB_001029c2:
          std::__cxx11::string::erase((ulong)&local_98,uVar9);
          std::__cxx11::string::_M_assign((string *)&local_98);
          uVar9 = std::__cxx11::string::find(cVar14,0x3c);
        } while (uVar9 != 0xffffffffffffffff);
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_60,&local_98);
        if ((_Rb_tree_header *)iVar11._M_node == &local_60._M_impl.super__Rb_tree_header) {
          pTVar5 = (this->m_Templates).
                   super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar6 = (this->m_Templates).
                   super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          local_c0.size = (int)((ulong)((long)pTVar6 - (long)pTVar5) >> 3) * -0x33333333;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&local_60,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
            operator_delete(local_c0.name._M_dataplus._M_p,
                            CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                     local_c0.name.field_2._M_local_buf[0]) + 1);
          }
          local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
          local_c0.name._M_string_length = 0;
          local_c0.name.field_2._M_local_buf[0] = '\0';
          local_c0.size = 0;
          local_c0.count = 0;
          std::__cxx11::string::_M_assign((string *)&local_c0);
          local_c0.count = 1;
          local_c0.size = pSVar15->size;
          std::vector<TemplateInfo,std::allocator<TemplateInfo>>::emplace_back<TemplateInfo&>
                    (local_78,&local_c0);
          this = local_70;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
            operator_delete(local_c0.name._M_dataplus._M_p,
                            CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                     local_c0.name.field_2._M_local_buf[0]) + 1);
            this = local_70;
          }
        }
        else {
          uVar2 = *(undefined8 *)
                   (*(long *)local_78 + 0x20 + (long)(int)iVar11._M_node[2]._M_color * 0x28);
          *(ulong *)(*(long *)local_78 + 0x20 + (long)(int)iVar11._M_node[2]._M_color * 0x28) =
               CONCAT44((int)((ulong)uVar2 >> 0x20) + 1,pSVar15->size + (int)uVar2);
        }
      }
      if (pSVar15->sectionType == Data) {
        uVar3 = pSVar15->size;
        puVar1 = &(this->m_ObjectFiles).
                  super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar15->objectFileIndex].dataSize;
        *puVar1 = *puVar1 + uVar3;
        puVar1 = &(this->m_Namespaces).
                  super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar15->namespaceIndex].dataSize;
        *puVar1 = *puVar1 + uVar3;
      }
      else if (pSVar15->sectionType == Code) {
        uVar3 = pSVar15->size;
        puVar1 = &(this->m_ObjectFiles).
                  super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar15->objectFileIndex].codeSize;
        *puVar1 = *puVar1 + uVar3;
        puVar1 = &(this->m_Namespaces).
                  super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar15->namespaceIndex].codeSize;
        *puVar1 = *puVar1 + uVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pSVar15 = pSVar15 + 1;
    } while (pSVar15 != local_68);
  }
  pCVar12 = (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pCVar7 = (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar12 != pCVar7) {
    pOVar8 = (this->m_ObjectFiles).
             super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (pCVar12->sectionType == Data) {
        puVar1 = &pOVar8[pCVar12->objectFileIndex].contribDataSize;
        *puVar1 = *puVar1 + pCVar12->size;
      }
      else if (pCVar12->sectionType == Code) {
        puVar1 = &pOVar8[pCVar12->objectFileIndex].contribCodeSize;
        *puVar1 = *puVar1 + pCVar12->size;
      }
      pCVar12 = pCVar12 + 1;
    } while (pCVar12 != pCVar7);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DebugInfo::ComputeDerivedData()
{
    std::map<std::string, int> templateToIndex;

    for (const auto& sym : m_Symbols)
    {
        // aggregate templates
        std::string templateName = sym.name;
        bool isTemplate = StripTemplateParams(templateName);
        if (isTemplate)
        {
            auto it = templateToIndex.find(templateName);
            int index;
            if (it != templateToIndex.end())
            {
                index = it->second;
                m_Templates[index].size += sym.size;
                m_Templates[index].count++;
            }
            else
            {
                index = int(m_Templates.size());
                templateToIndex.insert(std::make_pair(templateName, index));
                TemplateInfo info;
                info.name = templateName;
                info.count = 1;
                info.size = sym.size;
                m_Templates.emplace_back(info);
            }
        }

        // aggregate object file / namespace sizes
        if (sym.sectionType == SectionType::Code)
        {
            m_ObjectFiles[sym.objectFileIndex].codeSize += sym.size;
            m_Namespaces[sym.namespaceIndex].codeSize += sym.size;
        }
        else if (sym.sectionType == SectionType::Data)
        {
            m_ObjectFiles[sym.objectFileIndex].dataSize += sym.size;
            m_Namespaces[sym.namespaceIndex].dataSize += sym.size;
        }
    }

    for (const auto& ctr : m_Contribs)
    {
        // aggregate object file / namespace sizes
        if (ctr.sectionType == SectionType::Code)
        {
            m_ObjectFiles[ctr.objectFileIndex].contribCodeSize += ctr.size;
        }
        else if (ctr.sectionType == SectionType::Data)
        {
            m_ObjectFiles[ctr.objectFileIndex].contribDataSize += ctr.size;
        }
    }
}